

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O2

UBool __thiscall icu_63::UVector::containsNone(UVector *this,UVector *other)

{
  int iVar1;
  long lVar2;
  int32_t iVar3;
  long lVar4;
  
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    iVar1 = other->count;
    if (iVar1 <= lVar4) break;
    iVar3 = indexOf(this,other->elements[lVar4],0,'\0');
    lVar2 = lVar4 + 1;
  } while (iVar3 < 0);
  return iVar1 <= lVar4;
}

Assistant:

UBool UVector::containsNone(const UVector& other) const {
    for (int32_t i=0; i<other.size(); ++i) {
        if (indexOf(other.elements[i]) >= 0) {
            return FALSE;
        }
    }
    return TRUE;
}